

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PermuteLayerParams::SerializeWithCachedSizes
          (PermuteLayerParams *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  iVar1 = (this->axis_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_axis_cached_byte_size_);
    iVar1 = (this->axis_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = axis(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void PermuteLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PermuteLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 axis = 1;
  if (this->axis_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_axis_cached_byte_size_);
  }
  for (int i = 0, n = this->axis_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->axis(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PermuteLayerParams)
}